

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

FADFADSTATE * FADsinh(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  double dVar1;
  uint sz;
  double *pdVar2;
  double *pdVar3;
  FADFADSTATE *extraout_RAX;
  long lVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  Fad<double> sinhval;
  Fad<double> coshval;
  FadExpr<FadFuncCosh<Fad<double>_>_> local_b8;
  Fad<double> local_90;
  Fad<double> local_70;
  undefined1 local_50 [32];
  
  FadFuncCosh<Fad<double>_>::FadFuncCosh((FadFuncCosh<Fad<double>_> *)local_50,&x->val_);
  FadExpr<FadFuncCosh<Fad<double>_>_>::FadExpr(&local_b8,(FadFuncCosh<Fad<double>_> *)local_50);
  Fad<double>::~Fad((Fad<double> *)local_50);
  local_70.val_ = cosh(local_b8.fadexpr_.expr_.val_);
  local_70.dx_.num_elts = 0;
  local_70.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_b8.fadexpr_.expr_.dx_.num_elts < 1) {
    local_70.defaultVal = 0.0;
  }
  else {
    local_70.dx_.num_elts = local_b8.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_b8.fadexpr_.expr_.dx_.num_elts * 8;
    pdVar2 = (double *)operator_new__(uVar5);
    local_70.dx_.ptr_to_data = pdVar2;
    local_70.defaultVal = 0.0;
    uVar6 = 0;
    do {
      pdVar3 = (double *)((long)local_b8.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
      if (local_b8.fadexpr_.expr_.dx_.num_elts == 0) {
        pdVar3 = &local_b8.fadexpr_.expr_.defaultVal;
      }
      dVar1 = *pdVar3;
      dVar7 = sinh(local_b8.fadexpr_.expr_.val_);
      *(double *)((long)pdVar2 + uVar6) = dVar7 * dVar1;
      uVar6 = uVar6 + 8;
    } while (uVar5 != uVar6);
  }
  Fad<double>::~Fad(&local_b8.fadexpr_.expr_);
  FadFuncSinh<Fad<double>_>::FadFuncSinh((FadFuncSinh<Fad<double>_> *)local_50,&x->val_);
  FadExpr<FadFuncSinh<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSinh<Fad<double>_>_> *)&local_b8,(FadFuncSinh<Fad<double>_> *)local_50)
  ;
  Fad<double>::~Fad((Fad<double> *)local_50);
  local_90.val_ = sinh(local_b8.fadexpr_.expr_.val_);
  local_90.dx_.num_elts = 0;
  local_90.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_b8.fadexpr_.expr_.dx_.num_elts < 1) {
    local_90.defaultVal = 0.0;
  }
  else {
    local_90.dx_.num_elts = local_b8.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_b8.fadexpr_.expr_.dx_.num_elts * 8;
    pdVar2 = (double *)operator_new__(uVar5);
    local_90.dx_.ptr_to_data = pdVar2;
    local_90.defaultVal = 0.0;
    uVar6 = 0;
    do {
      pdVar3 = (double *)((long)local_b8.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
      if (local_b8.fadexpr_.expr_.dx_.num_elts == 0) {
        pdVar3 = &local_b8.fadexpr_.expr_.defaultVal;
      }
      dVar1 = *pdVar3;
      dVar7 = cosh(local_b8.fadexpr_.expr_.val_);
      *(double *)((long)pdVar2 + uVar6) = dVar7 * dVar1;
      uVar6 = uVar6 + 8;
    } while (uVar5 != uVar6);
  }
  Fad<double>::~Fad(&local_b8.fadexpr_.expr_);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_90);
  if (0 < (int)sz) {
    lVar4 = 0;
    i = 0;
    do {
      Fad<Fad<double>_>::dx((Fad<double> *)&local_b8,x,i);
      local_50._0_8_ = &local_70;
      local_50._8_8_ = (Fad<double> *)&local_b8;
      Fad<double>::operator=
                ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + lVar4),
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_50);
      Fad<double>::~Fad((Fad<double> *)&local_b8);
      i = i + 1;
      lVar4 = lVar4 + 0x20;
    } while ((ulong)sz << 5 != lVar4);
  }
  Fad<double>::~Fad(&local_90);
  Fad<double>::~Fad(&local_70);
  return extraout_RAX;
}

Assistant:

static FADFADSTATE FADsinh(FADFADSTATE x)
{
    Fad<STATE> coshval = cosh(x.val());
    Fad<STATE> sinhval = sinh(x.val());
    int sz = x.size();
    FADFADSTATE resa(sz,sinhval);
    for (int i=0; i<sz; i++) {
        resa.fastAccessDx(i) = coshval*x.dx(i);
    }
    return resa;
}